

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappingTypes.hpp
# Opt level: O2

ostream * operator<<(ostream *os,LongReadMapping *m)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"LongReadMapping ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->qStart);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->qEnd);
  poVar1 = std::operator<<(poVar1,") -> ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->nStart);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->nEnd);
  poVar1 = std::operator<<(poVar1,")  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->score);
  std::operator<<(poVar1," hits");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LongReadMapping& m){
        os << "LongReadMapping " << m.read_id << " (" << m.qStart << ":" << m.qEnd << ") -> "
                                  << m.node << " (" << m.nStart << ":" << m.nEnd << ")  " <<m.score<< " hits";
        return os;
    }